

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateEncoderBody(SwiftGenerator *this,StructDef *struct_def)

{
  int *piVar1;
  BaseType BVar2;
  int iVar3;
  FieldDef *field;
  EnumDef *pEVar4;
  bool bVar5;
  pointer ppFVar6;
  uint uVar7;
  string *psVar8;
  allocator<char> local_249;
  CodeWriter *local_248;
  undefined4 local_23c;
  SwiftGenerator *local_238;
  ulong local_230;
  string local_228;
  BaseType local_204;
  StructDef *local_200;
  IdlNamer *local_1f8;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"var container = encoder.container(keyedBy: CodingKeys.self)",
             (allocator<char> *)&local_228);
  local_248 = &this->code_;
  CodeWriter::operator+=(local_248,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_1f8 = &this->namer_;
  local_238 = this;
  local_200 = struct_def;
  do {
    if (ppFVar6 ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    field = *ppFVar6;
    if (field->deprecated == false) {
      BVar2 = (field->value).type.base_type;
      local_230 = (ulong)BVar2;
      local_204 = (field->value).type.element;
      if ((BVar2 == BASE_TYPE_ARRAY) || (BVar2 == BASE_TYPE_VECTOR)) {
        local_23c = CONCAT31((int3)(BVar2 >> 8),local_204 != BASE_TYPE_UTYPE);
      }
      else {
        local_23c = 0;
      }
      pEVar4 = (field->value).type.enum_def;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"FIELDVAR",&local_249)
      ;
      (*(local_1f8->super_Namer)._vptr_Namer[7])(&local_1f0,local_1f8,field);
      CodeWriter::SetValue(local_248,&local_228,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"CONSTANT",&local_249)
      ;
      SwiftConstant_abi_cxx11_(&local_1f0,this,field);
      CodeWriter::SetValue(local_248,&local_228,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_228);
      if ((char)local_23c == '\0') {
        uVar7 = (int)local_230 - 1;
        if (uVar7 < 10 && pEVar4 != (EnumDef *)0x0) {
          if (field->presence == kOptional) goto LAB_002179d4;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,"CONSTANT",&local_249);
          this = local_238;
          GenEnumDefaultValue_abi_cxx11_(&local_1f0,local_238,field);
          CodeWriter::SetValue(local_248,&local_228,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_228);
          psVar8 = &local_70;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar8,"if {{FIELDVAR}} != {{CONSTANT}} {",
                     (allocator<char> *)&local_228);
          CodeWriter::operator+=(local_248,psVar8);
          goto LAB_0021781e;
        }
        if (((int)local_230 - 0xbU < 2) &&
           (bVar5 = StringIsFlatbufferNan(&(field->value).constant), bVar5)) {
          psVar8 = &local_90;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar8,"if !{{FIELDVAR}}.isNaN {",(allocator<char> *)&local_228);
          CodeWriter::operator+=(local_248,psVar8);
          this = local_238;
          goto LAB_0021781e;
        }
        if (uVar7 < 0xc) {
          if ((int)local_230 == 2) {
            if (field->presence == kOptional) goto LAB_002179d4;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_228,"CONSTANT",&local_249);
            this = local_238;
            SwiftConstant_abi_cxx11_(&local_1f0,local_238,field);
            CodeWriter::SetValue(local_248,&local_228,&local_1f0);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_228);
            psVar8 = &local_d0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)psVar8,"if {{FIELDVAR}} != {{CONSTANT}} {",
                       (allocator<char> *)&local_228);
            CodeWriter::operator+=(local_248,psVar8);
          }
          else {
            if (field->presence == kOptional) goto LAB_002179d4;
            psVar8 = &local_b0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)psVar8,"if {{FIELDVAR}} != {{CONSTANT}} {",
                       (allocator<char> *)&local_228);
            this = local_238;
            CodeWriter::operator+=(local_248,psVar8);
          }
          goto LAB_0021781e;
        }
LAB_002179d4:
        bVar5 = false;
      }
      else {
        psVar8 = &local_50;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar8,"if {{FIELDVAR}}Count > 0 {",(allocator<char> *)&local_228);
        CodeWriter::operator+=(local_248,psVar8);
LAB_0021781e:
        std::__cxx11::string::~string((string *)psVar8);
        piVar1 = &(this->code_).cur_ident_lvl_;
        *piVar1 = *piVar1 + 1;
        bVar5 = true;
      }
      if (((pEVar4 == (EnumDef *)0x0) || (0xfffffff5 < (int)local_230 - 0xbU)) ||
         (pEVar4->is_union == false)) {
        if (((char)local_23c == '\0') ||
           ((local_204 - BASE_TYPE_UTYPE < 0xc &&
            (9 < local_204 - BASE_TYPE_UTYPE || pEVar4 == (EnumDef *)0x0)))) {
          psVar8 = &local_190;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar8,
                     "try container.encodeIfPresent({{FIELDVAR}}, forKey: .{{FIELDVAR}})",
                     (allocator<char> *)&local_228);
          CodeWriter::operator+=(local_248,psVar8);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,
                     "var contentEncoder = container.nestedUnkeyedContainer(forKey: .{{FIELDVAR}})",
                     (allocator<char> *)&local_228);
          CodeWriter::operator+=(local_248,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"for index in 0..<{{FIELDVAR}}Count {",
                     (allocator<char> *)&local_228);
          CodeWriter::operator+=(local_248,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          piVar1 = &(local_238->code_).cur_ident_lvl_;
          *piVar1 = *piVar1 + 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,
                     "guard let type = {{FIELDVAR}}(at: index) else { continue }",
                     (allocator<char> *)&local_228);
          CodeWriter::operator+=(local_248,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"try contentEncoder.encode(type)",
                     (allocator<char> *)&local_228);
          CodeWriter::operator+=(local_248,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          iVar3 = (local_238->code_).cur_ident_lvl_;
          if (iVar3 != 0) {
            (local_238->code_).cur_ident_lvl_ = iVar3 + -1;
          }
          psVar8 = &local_170;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)psVar8,"}",(allocator<char> *)&local_228);
          CodeWriter::operator+=(local_248,psVar8);
        }
        std::__cxx11::string::~string((string *)psVar8);
      }
      else {
        GenerateEncoderUnionBody(local_238,field);
      }
      struct_def = local_200;
      this = local_238;
      if ((bVar5) && (iVar3 = (local_238->code_).cur_ident_lvl_, iVar3 != 0)) {
        (local_238->code_).cur_ident_lvl_ = iVar3 + -1;
      }
      if (((char)local_23c != '\0') ||
         (((int)local_230 - 1U < 0xc && (field->presence != kOptional)))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"}",(allocator<char> *)&local_228);
        CodeWriter::operator+=(local_248,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
    }
    ppFVar6 = ppFVar6 + 1;
  } while( true );
}

Assistant:

void GenerateEncoderBody(const StructDef &struct_def) {
    code_ += "var container = encoder.container(keyedBy: CodingKeys.self)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto type = field.value.type;

      const auto is_non_union_vector =
          (field.value.type.base_type == BASE_TYPE_ARRAY ||
           field.value.type.base_type == BASE_TYPE_VECTOR) &&
          field.value.type.VectorType().base_type != BASE_TYPE_UTYPE;

      code_.SetValue("FIELDVAR", namer_.Variable(field));
      code_.SetValue("CONSTANT", SwiftConstant(field));
      bool should_indent = true;
      if (is_non_union_vector) {
        code_ += "if {{FIELDVAR}}Count > 0 {";
      } else if (IsEnum(type) && !field.IsOptional()) {
        code_.SetValue("CONSTANT", GenEnumDefaultValue(field));
        code_ += "if {{FIELDVAR}} != {{CONSTANT}} {";
      } else if (IsFloat(type.base_type) &&
                 StringIsFlatbufferNan(field.value.constant)) {
        code_ += "if !{{FIELDVAR}}.isNaN {";
      } else if (IsScalar(type.base_type) && !IsEnum(type) &&
                 !IsBool(type.base_type) && !field.IsOptional()) {
        code_ += "if {{FIELDVAR}} != {{CONSTANT}} {";
      } else if (IsBool(type.base_type) && !field.IsOptional()) {
        code_.SetValue("CONSTANT", SwiftConstant(field));
        code_ += "if {{FIELDVAR}} != {{CONSTANT}} {";
      } else {
        should_indent = false;
      }
      if (should_indent) Indent();

      if (IsUnion(type) && !IsEnum(type)) {
        GenerateEncoderUnionBody(field);
      } else if (is_non_union_vector &&
                 (!IsScalar(type.VectorType().base_type) ||
                  IsEnum(type.VectorType()))) {
        code_ +=
            "var contentEncoder = container.nestedUnkeyedContainer(forKey: "
            ".{{FIELDVAR}})";
        code_ += "for index in 0..<{{FIELDVAR}}Count {";
        Indent();
        code_ += "guard let type = {{FIELDVAR}}(at: index) else { continue }";
        code_ += "try contentEncoder.encode(type)";
        Outdent();
        code_ += "}";
      } else {
        code_ +=
            "try container.encodeIfPresent({{FIELDVAR}}, forKey: "
            ".{{FIELDVAR}})";
      }
      if (should_indent) Outdent();

      if (is_non_union_vector ||
          (IsScalar(type.base_type) && !field.IsOptional())) {
        code_ += "}";
      }
    }
  }